

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_31::HttpOutputStream::writeBodyData
          (HttpOutputStream *this,void *buffer,size_t size)

{
  Exception *in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar1;
  Promise<void> PVar2;
  void *local_c0 [2];
  void *local_b0;
  size_t local_a8;
  Exception *local_a0;
  undefined1 local_98 [32];
  ForkedPromise<void> local_78;
  undefined1 local_68 [8];
  ForkedPromise<void> fork;
  Fault local_50;
  Fault f_1;
  Fault local_30;
  Fault f;
  size_t size_local;
  void *buffer_local;
  HttpOutputStream *this_local;
  
  if (((*(byte *)((long)buffer + 0x1a) ^ 0xff) & 1) == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x69e,FAILED,"!writeInProgress","\"concurrent write()s not allowed\"",
               (char (*) [32])"concurrent write()s not allowed");
    Promise<void>::Promise((Promise<void> *)this);
    _::Debug::Fault::~Fault(&local_30);
    pPVar1 = extraout_RDX;
  }
  else if ((*(byte *)((long)buffer + 0x18) & 1) == 0) {
    _::Debug::Fault::Fault
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x69f,FAILED,"inBody","");
    Promise<void>::Promise((Promise<void> *)this);
    _::Debug::Fault::~Fault(&local_50);
    pPVar1 = extraout_RDX_00;
  }
  else {
    *(undefined1 *)((long)buffer + 0x1a) = 1;
    f.exception = in_RCX;
    Promise<void>::fork((Promise<void> *)local_68);
    ForkedPromise<void>::addBranch(&local_78);
    Promise<void>::operator=((Promise<void> *)((long)buffer + 8),(Promise<void> *)&local_78);
    Promise<void>::~Promise((Promise<void> *)&local_78);
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_98);
    local_a0 = f.exception;
    local_b0 = buffer;
    local_a8 = size;
    Promise<void>::
    then<kj::(anonymous_namespace)::HttpOutputStream::writeBodyData(void_const*,unsigned_long)::_lambda()_1_,kj::_::PropagateException>
              ((Promise<void> *)(local_98 + 0x10),(Type *)local_98,(PropagateException *)&local_b0);
    local_c0[0] = buffer;
    Promise<void>::
    then<kj::(anonymous_namespace)::HttpOutputStream::writeBodyData(void_const*,unsigned_long)::_lambda()_2_,kj::_::PropagateException>
              ((Promise<void> *)this,(Type *)(local_98 + 0x10),(PropagateException *)local_c0);
    Promise<void>::~Promise((Promise<void> *)(local_98 + 0x10));
    Promise<void>::~Promise((Promise<void> *)local_98);
    ForkedPromise<void>::~ForkedPromise((ForkedPromise<void> *)local_68);
    pPVar1 = extraout_RDX_01;
  }
  PVar2.super_PromiseBase.node.ptr = pPVar1;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> writeBodyData(const void* buffer, size_t size) {
    KJ_REQUIRE(!writeInProgress, "concurrent write()s not allowed") { return kj::READY_NOW; }
    KJ_REQUIRE(inBody) { return kj::READY_NOW; }

    writeInProgress = true;
    auto fork = writeQueue.fork();
    writeQueue = fork.addBranch();

    return fork.addBranch().then([this,buffer,size]() {
      return inner.write(buffer, size);
    }).then([this]() {
      writeInProgress = false;
    });
  }